

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

_Bool process_pref_file_named(char *path,_Bool quiet,_Bool user)

{
  _Bool _Var1;
  ang_file *f_00;
  parser *p_00;
  void *p_01;
  parser *p;
  char local_428 [4];
  wchar_t line_no;
  char line [1024];
  errr e;
  ang_file *f;
  _Bool user_local;
  _Bool quiet_local;
  char *path_local;
  
  f_00 = file_open(path,MODE_READ,0xffffffff);
  line[0x3fc] = '\0';
  line[0x3fd] = '\0';
  line[0x3fe] = '\0';
  line[0x3ff] = '\0';
  if (f_00 == (ang_file *)0x0) {
    if (!quiet) {
      msg("Cannot open \'%s\'.",path);
    }
    line[0x3fc] = '\x05';
    line[0x3fd] = '\0';
    line[0x3fe] = '\0';
    line[0x3ff] = '\0';
  }
  else {
    p_00 = init_parse_prefs(user);
    do {
      _Var1 = file_getl(f_00,local_428,0x400);
      if (!_Var1) goto LAB_002452c0;
      line._1020_4_ = parser_parse(p_00,local_428);
    } while (line._1020_4_ == PARSE_ERROR_NONE);
    print_error(path,p_00);
LAB_002452c0:
    finish_parse_prefs(p_00);
    file_close(f_00);
    p_01 = parser_priv(p_00);
    mem_free(p_01);
    parser_destroy(p_00);
  }
  return line._1020_4_ == 0;
}

Assistant:

static bool process_pref_file_named(const char *path, bool quiet, bool user) {
	ang_file *f = file_open(path, MODE_READ, -1);
	errr e = 0;

	if (!f) {
		if (!quiet)
			msg("Cannot open '%s'.", path);

		e = PARSE_ERROR_INTERNAL; /* signal failure to callers */
	} else {
		char line[1024];
		int line_no = 0;

		struct parser *p = init_parse_prefs(user);
		while (file_getl(f, line, sizeof line)) {
			line_no++;

			e = parser_parse(p, line);
			if (e != PARSE_ERROR_NONE) {
				print_error(path, p);
				break;
			}
		}
		finish_parse_prefs(p);

		file_close(f);
		mem_free(parser_priv(p));
		parser_destroy(p);
	}

	/* Result */
	return e == PARSE_ERROR_NONE;
}